

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

Wrench * __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation
          (Wrench *__return_storage_ptr__,KinDynComputationsPrivateAttributes *this,
          Wrench *wrenchInBodyFixed,Transform *inertial_X_link)

{
  Wrench *pWVar1;
  
  if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
    pWVar1 = (Wrench *)iDynTree::Transform::getRotation();
    iDynTree::Rotation::operator*((Rotation *)__return_storage_ptr__,pWVar1);
  }
  else if (this->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
    iDynTree::Wrench::Wrench(__return_storage_ptr__,wrenchInBodyFixed);
  }
  else {
    iDynTree::Transform::operator*((Transform *)__return_storage_ptr__,(Wrench *)inertial_X_link);
  }
  return __return_storage_ptr__;
}

Assistant:

Wrench KinDynComputations::KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation(const Wrench & wrenchInBodyFixed,
                                                                                                  const Transform & inertial_X_link)
{
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return Wrench(wrenchInBodyFixed);
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return inertial_X_link.getRotation()*wrenchInBodyFixed;
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        return inertial_X_link*wrenchInBodyFixed;
    }

    assert(false);
    return Wrench::Zero();
}